

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_xbm.c
# Opt level: O2

void gdImageXbmCtx(gdImagePtr image,char *file_name,int fg,gdIOCtx *out)

{
  _func_int_gdIOCtx_ptr_void_ptr_int *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  ushort **ppuVar10;
  int y;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  int x;
  int local_5c;
  uint uVar14;
  
  pcVar6 = strrchr(file_name,0x2f);
  pcVar8 = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    pcVar8 = file_name;
  }
  pcVar7 = strrchr(pcVar8,0x5c);
  pcVar6 = pcVar7 + 1;
  if (pcVar7 == (char *)0x0) {
    pcVar6 = pcVar8;
  }
  pcVar6 = strdup(pcVar6);
  pcVar8 = strrchr(pcVar6,0x2e);
  if ((pcVar8 != (char *)0x0) && (iVar3 = strcasecmp(pcVar8,".XBM"), iVar3 == 0)) {
    *pcVar8 = '\0';
  }
  sVar9 = strlen(pcVar6);
  if (sVar9 == 0) {
    free(pcVar6);
    pcVar6 = strdup("image");
  }
  else {
    ppuVar10 = __ctype_b_loc();
    for (sVar12 = 0; sVar9 != sVar12; sVar12 = sVar12 + 1) {
      if ((*(byte *)((long)*ppuVar10 + (long)pcVar6[sVar12] * 2 + 1) & 0xb) == 0) {
        pcVar6[sVar12] = '_';
      }
    }
  }
  (*out->putBuf)(out,"#define ",8);
  p_Var1 = out->putBuf;
  sVar9 = strlen(pcVar6);
  (*p_Var1)(out,pcVar6,(int)sVar9);
  (*out->putBuf)(out,"_width ",7);
  gdCtxPrintf(out,"%d\n",(ulong)(uint)image->sx);
  (*out->putBuf)(out,"#define ",8);
  p_Var1 = out->putBuf;
  sVar9 = strlen(pcVar6);
  (*p_Var1)(out,pcVar6,(int)sVar9);
  (*out->putBuf)(out,"_height ",8);
  gdCtxPrintf(out,"%d\n",(ulong)(uint)image->sy);
  (*out->putBuf)(out,"static unsigned char ",0x15);
  p_Var1 = out->putBuf;
  sVar9 = strlen(pcVar6);
  (*p_Var1)(out,pcVar6,(int)sVar9);
  (*out->putBuf)(out,"_bits[] = {\n  ",0xe);
  free(pcVar6);
  iVar3 = image->sx;
  iVar4 = image->sy;
  iVar2 = iVar3;
  if (iVar3 < 1) {
    iVar2 = 0;
  }
  uVar13 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar11 = 1;
  local_5c = 0;
  for (y = 0; y != iVar4; y = y + 1) {
    for (x = 0; iVar2 != x; x = x + 1) {
      iVar5 = gdImageGetPixel(image,x,y);
      uVar14 = 0;
      if (iVar5 == fg) {
        uVar14 = uVar11;
      }
      uVar13 = uVar14 | uVar13;
      if (iVar3 + -1 == x || uVar11 == 0x80) {
        iVar5 = 0;
        if ((local_5c != 0) && ((*out->putBuf)(out,", ",2), iVar5 = local_5c, local_5c % 0xc == 0))
        {
          (*out->putBuf)(out,"\n  ",3);
          iVar5 = 0xc;
        }
        local_5c = iVar5 + 1;
        gdCtxPrintf(out,"0x%02X",(ulong)uVar13);
        uVar11 = 1;
        uVar13 = 0;
      }
      else {
        uVar11 = uVar11 * 2;
      }
    }
  }
  (*out->putBuf)(out,"};\n",3);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageXbmCtx(gdImagePtr image, char* file_name, int fg, gdIOCtx * out)
{
	int x, y, c, b, sx, sy, p;
	char *name, *f;
	size_t i, l;

	name = file_name;
	if ((f = strrchr(name, '/')) != NULL) name = f+1;
	if ((f = strrchr(name, '\\')) != NULL) name = f+1;
	name = strdup(name);
	if ((f = strrchr(name, '.')) != NULL && !strcasecmp(f, ".XBM")) *f = '\0';
	if ((l = strlen(name)) == 0) {
		free(name);
		name = strdup("image");
	} else {
		for (i=0; i<l; i++) {
			/* only in C-locale isalnum() would work */
			if (!isupper(name[i]) && !islower(name[i]) && !isdigit(name[i])) {
				name[i] = '_';
			}
		}
	}

	/* Since "name" comes from the user, run it through a direct puts.
	 * Trying to printf it into a local buffer means we'd need a large
	 * or dynamic buffer to hold it all. */

	/* #define <name>_width 1234 */
	gdCtxPuts(out, "#define ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_width ");
	gdCtxPrintf(out, "%d\n", gdImageSX(image));

	/* #define <name>_height 1234 */
	gdCtxPuts(out, "#define ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_height ");
	gdCtxPrintf(out, "%d\n", gdImageSY(image));

	/* static unsigned char <name>_bits[] = {\n */
	gdCtxPuts(out, "static unsigned char ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_bits[] = {\n  ");

	free(name);

	b = 1;
	p = 0;
	c = 0;
	sx = gdImageSX(image);
	sy = gdImageSY(image);
	for (y = 0; y < sy; y++) {
		for (x = 0; x < sx; x++) {
			if (gdImageGetPixel(image, x, y) == fg) {
				c |= b;
			}
			if ((b == 128) || (x == sx - 1)) {
				b = 1;
				if (p) {
					gdCtxPuts(out, ", ");
					if (!(p%12)) {
						gdCtxPuts(out, "\n  ");
						p = 12;
					}
				}
				p++;
				gdCtxPrintf(out, "0x%02X", c);
				c = 0;
			} else {
				b <<= 1;
			}
		}
	}
	gdCtxPuts(out, "};\n");
}